

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O0

TestRequired *
google::protobuf::DynamicCastMessage<proto2_unittest::TestRequired>(MessageLite *from)

{
  TestRequired *pTVar1;
  bad_cast *this;
  TestRequired *destination_message;
  MessageLite *from_local;
  
  pTVar1 = DynamicCastMessage<proto2_unittest::TestRequired>(from);
  if (pTVar1 == (TestRequired *)0x0) {
    this = (bad_cast *)__cxa_allocate_exception(8);
    std::bad_cast::bad_cast(this);
    __cxa_throw(this,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
  }
  return pTVar1;
}

Assistant:

const T& DynamicCastMessage(const MessageLite& from) {
  const T* destination_message = DynamicCastMessage<T>(&from);
  if (ABSL_PREDICT_FALSE(destination_message == nullptr)) {
    // If exceptions are enabled, throw.
    // Otherwise, log a fatal error.
#if defined(ABSL_HAVE_EXCEPTIONS)
    throw std::bad_cast();
#endif
    // Move the logging into an out-of-line function to reduce bloat in the
    // caller.
    internal::FailDynamicCast(from, T::default_instance());
  }
  return *destination_message;
}